

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_subs_s_df_mips64el
               (CPUMIPSState_conflict10 *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t wt)

{
  char cVar1;
  short sVar2;
  float32 fVar3;
  int iVar4;
  float64 fVar5;
  float64 fVar6;
  long lVar7;
  long lVar8;
  fpr_t *pfVar9;
  fpr_t *pfVar10;
  fpr_t *pfVar11;
  char cVar12;
  short sVar13;
  float32 fVar14;
  int iVar15;
  long lVar16;
  char cVar17;
  short sVar18;
  float32 fVar19;
  int iVar20;
  ulong uVar21;
  float64 fVar22;
  
  if (3 < df) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                  ,0x12c6,
                  "void helper_msa_subs_s_df_mips64el(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                 );
  }
  pfVar9 = (env->active_fpu).fpr + wd;
  pfVar11 = (env->active_fpu).fpr + ws;
  pfVar10 = (env->active_fpu).fpr + wt;
  switch(df) {
  case 0:
    cVar1 = *(char *)pfVar11;
    uVar21 = (ulong)*(char *)pfVar10;
    cVar17 = cVar1 - *(char *)pfVar10;
    if ((long)uVar21 < 1) {
      cVar12 = '\x7f';
      if ((long)cVar1 < (long)(uVar21 + 0x7f)) {
        cVar12 = cVar17;
      }
    }
    else {
      cVar12 = -0x80;
      if ((long)(uVar21 | 0xffffffffffffff80) < (long)cVar1) {
        cVar12 = cVar17;
      }
    }
    *(char *)pfVar9 = cVar12;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 1);
    cVar17 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 1);
    uVar21 = (ulong)cVar17;
    cVar17 = cVar1 - cVar17;
    if ((long)uVar21 < 1) {
      cVar12 = '\x7f';
      if ((long)cVar1 < (long)(uVar21 + 0x7f)) {
        cVar12 = cVar17;
      }
    }
    else {
      cVar12 = -0x80;
      if ((long)(uVar21 | 0xffffffffffffff80) < (long)cVar1) {
        cVar12 = cVar17;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 1) = cVar12;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 2);
    cVar17 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 2);
    uVar21 = (ulong)cVar17;
    cVar17 = cVar1 - cVar17;
    if ((long)uVar21 < 1) {
      cVar12 = '\x7f';
      if ((long)cVar1 < (long)(uVar21 + 0x7f)) {
        cVar12 = cVar17;
      }
    }
    else {
      cVar12 = -0x80;
      if ((long)(uVar21 | 0xffffffffffffff80) < (long)cVar1) {
        cVar12 = cVar17;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 2) = cVar12;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 3);
    cVar17 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 3);
    uVar21 = (ulong)cVar17;
    cVar17 = cVar1 - cVar17;
    if ((long)uVar21 < 1) {
      cVar12 = '\x7f';
      if ((long)cVar1 < (long)(uVar21 + 0x7f)) {
        cVar12 = cVar17;
      }
    }
    else {
      cVar12 = -0x80;
      if ((long)(uVar21 | 0xffffffffffffff80) < (long)cVar1) {
        cVar12 = cVar17;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 3) = cVar12;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
    cVar17 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
    uVar21 = (ulong)cVar17;
    cVar17 = cVar1 - cVar17;
    if ((long)uVar21 < 1) {
      cVar12 = '\x7f';
      if ((long)cVar1 < (long)(uVar21 + 0x7f)) {
        cVar12 = cVar17;
      }
    }
    else {
      cVar12 = -0x80;
      if ((long)(uVar21 | 0xffffffffffffff80) < (long)cVar1) {
        cVar12 = cVar17;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4) = cVar12;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 5);
    cVar17 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 5);
    uVar21 = (ulong)cVar17;
    cVar17 = cVar1 - cVar17;
    if ((long)uVar21 < 1) {
      cVar12 = '\x7f';
      if ((long)cVar1 < (long)(uVar21 + 0x7f)) {
        cVar12 = cVar17;
      }
    }
    else {
      cVar12 = -0x80;
      if ((long)(uVar21 | 0xffffffffffffff80) < (long)cVar1) {
        cVar12 = cVar17;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 5) = cVar12;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 6);
    cVar17 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 6);
    uVar21 = (ulong)cVar17;
    cVar17 = cVar1 - cVar17;
    if ((long)uVar21 < 1) {
      cVar12 = '\x7f';
      if ((long)cVar1 < (long)(uVar21 + 0x7f)) {
        cVar12 = cVar17;
      }
    }
    else {
      cVar12 = -0x80;
      if ((long)(uVar21 | 0xffffffffffffff80) < (long)cVar1) {
        cVar12 = cVar17;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 6) = cVar12;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 7);
    cVar17 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 7);
    uVar21 = (ulong)cVar17;
    cVar17 = cVar1 - cVar17;
    if ((long)uVar21 < 1) {
      cVar12 = '\x7f';
      if ((long)cVar1 < (long)(uVar21 + 0x7f)) {
        cVar12 = cVar17;
      }
    }
    else {
      cVar12 = -0x80;
      if ((long)(uVar21 | 0xffffffffffffff80) < (long)cVar1) {
        cVar12 = cVar17;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 7) = cVar12;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
    cVar17 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
    uVar21 = (ulong)cVar17;
    cVar17 = cVar1 - cVar17;
    if ((long)uVar21 < 1) {
      cVar12 = '\x7f';
      if ((long)cVar1 < (long)(uVar21 + 0x7f)) {
        cVar12 = cVar17;
      }
    }
    else {
      cVar12 = -0x80;
      if ((long)(uVar21 | 0xffffffffffffff80) < (long)cVar1) {
        cVar12 = cVar17;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = cVar12;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 9);
    cVar17 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 9);
    uVar21 = (ulong)cVar17;
    cVar17 = cVar1 - cVar17;
    if ((long)uVar21 < 1) {
      cVar12 = '\x7f';
      if ((long)cVar1 < (long)(uVar21 + 0x7f)) {
        cVar12 = cVar17;
      }
    }
    else {
      cVar12 = -0x80;
      if ((long)(uVar21 | 0xffffffffffffff80) < (long)cVar1) {
        cVar12 = cVar17;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 9) = cVar12;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 10);
    cVar17 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 10);
    uVar21 = (ulong)cVar17;
    cVar17 = cVar1 - cVar17;
    if ((long)uVar21 < 1) {
      cVar12 = '\x7f';
      if ((long)cVar1 < (long)(uVar21 + 0x7f)) {
        cVar12 = cVar17;
      }
    }
    else {
      cVar12 = -0x80;
      if ((long)(uVar21 | 0xffffffffffffff80) < (long)cVar1) {
        cVar12 = cVar17;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 10) = cVar12;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xb);
    cVar17 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xb);
    uVar21 = (ulong)cVar17;
    cVar17 = cVar1 - cVar17;
    if ((long)uVar21 < 1) {
      cVar12 = '\x7f';
      if ((long)cVar1 < (long)(uVar21 + 0x7f)) {
        cVar12 = cVar17;
      }
    }
    else {
      cVar12 = -0x80;
      if ((long)(uVar21 | 0xffffffffffffff80) < (long)cVar1) {
        cVar12 = cVar17;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xb) = cVar12;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
    cVar17 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
    uVar21 = (ulong)cVar17;
    cVar17 = cVar1 - cVar17;
    if ((long)uVar21 < 1) {
      cVar12 = '\x7f';
      if ((long)cVar1 < (long)(uVar21 + 0x7f)) {
        cVar12 = cVar17;
      }
    }
    else {
      cVar12 = -0x80;
      if ((long)(uVar21 | 0xffffffffffffff80) < (long)cVar1) {
        cVar12 = cVar17;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc) = cVar12;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xd);
    cVar17 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xd);
    uVar21 = (ulong)cVar17;
    cVar17 = cVar1 - cVar17;
    if ((long)uVar21 < 1) {
      cVar12 = '\x7f';
      if ((long)cVar1 < (long)(uVar21 + 0x7f)) {
        cVar12 = cVar17;
      }
    }
    else {
      cVar12 = -0x80;
      if ((long)(uVar21 | 0xffffffffffffff80) < (long)cVar1) {
        cVar12 = cVar17;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xd) = cVar12;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xe);
    cVar17 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xe);
    uVar21 = (ulong)cVar17;
    cVar17 = cVar1 - cVar17;
    if ((long)uVar21 < 1) {
      cVar12 = '\x7f';
      if ((long)cVar1 < (long)(uVar21 + 0x7f)) {
        cVar12 = cVar17;
      }
    }
    else {
      cVar12 = -0x80;
      if ((long)(uVar21 | 0xffffffffffffff80) < (long)cVar1) {
        cVar12 = cVar17;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xe) = cVar12;
    cVar1 = *(char *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xf);
    cVar17 = *(char *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xf);
    uVar21 = (ulong)cVar17;
    cVar17 = cVar1 - cVar17;
    if ((long)uVar21 < 1) {
      cVar12 = '\x7f';
      if ((long)cVar1 < (long)(uVar21 + 0x7f)) {
        cVar12 = cVar17;
      }
    }
    else {
      cVar12 = -0x80;
      if ((long)(uVar21 | 0xffffffffffffff80) < (long)cVar1) {
        cVar12 = cVar17;
      }
    }
    *(char *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xf) = cVar12;
    return;
  case 1:
    sVar2 = *(short *)pfVar11;
    uVar21 = (ulong)*(short *)pfVar10;
    sVar13 = sVar2 - *(short *)pfVar10;
    if ((long)uVar21 < 1) {
      sVar18 = 0x7fff;
      if ((long)sVar2 < (long)(uVar21 + 0x7fff)) {
        sVar18 = sVar13;
      }
    }
    else {
      sVar18 = -0x8000;
      if ((long)(uVar21 | 0xffffffffffff8000) < (long)sVar2) {
        sVar18 = sVar13;
      }
    }
    *(short *)pfVar9 = sVar18;
    sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 2);
    sVar13 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 2);
    uVar21 = (ulong)sVar13;
    sVar13 = sVar2 - sVar13;
    if ((long)uVar21 < 1) {
      sVar18 = 0x7fff;
      if ((long)sVar2 < (long)(uVar21 + 0x7fff)) {
        sVar18 = sVar13;
      }
    }
    else {
      sVar18 = -0x8000;
      if ((long)(uVar21 | 0xffffffffffff8000) < (long)sVar2) {
        sVar18 = sVar13;
      }
    }
    *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 2) = sVar18;
    sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
    sVar13 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
    uVar21 = (ulong)sVar13;
    sVar13 = sVar2 - sVar13;
    if ((long)uVar21 < 1) {
      sVar18 = 0x7fff;
      if ((long)sVar2 < (long)(uVar21 + 0x7fff)) {
        sVar18 = sVar13;
      }
    }
    else {
      sVar18 = -0x8000;
      if ((long)(uVar21 | 0xffffffffffff8000) < (long)sVar2) {
        sVar18 = sVar13;
      }
    }
    *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4) = sVar18;
    sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 6);
    sVar13 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 6);
    uVar21 = (ulong)sVar13;
    sVar13 = sVar2 - sVar13;
    if ((long)uVar21 < 1) {
      sVar18 = 0x7fff;
      if ((long)sVar2 < (long)(uVar21 + 0x7fff)) {
        sVar18 = sVar13;
      }
    }
    else {
      sVar18 = -0x8000;
      if ((long)(uVar21 | 0xffffffffffff8000) < (long)sVar2) {
        sVar18 = sVar13;
      }
    }
    *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 6) = sVar18;
    sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
    sVar13 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
    uVar21 = (ulong)sVar13;
    sVar13 = sVar2 - sVar13;
    if ((long)uVar21 < 1) {
      sVar18 = 0x7fff;
      if ((long)sVar2 < (long)(uVar21 + 0x7fff)) {
        sVar18 = sVar13;
      }
    }
    else {
      sVar18 = -0x8000;
      if ((long)(uVar21 | 0xffffffffffff8000) < (long)sVar2) {
        sVar18 = sVar13;
      }
    }
    *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = sVar18;
    sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 10);
    sVar13 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 10);
    uVar21 = (ulong)sVar13;
    sVar13 = sVar2 - sVar13;
    if ((long)uVar21 < 1) {
      sVar18 = 0x7fff;
      if ((long)sVar2 < (long)(uVar21 + 0x7fff)) {
        sVar18 = sVar13;
      }
    }
    else {
      sVar18 = -0x8000;
      if ((long)(uVar21 | 0xffffffffffff8000) < (long)sVar2) {
        sVar18 = sVar13;
      }
    }
    break;
  case 2:
    fVar3 = pfVar11->fs[0];
    uVar21 = (ulong)(int)pfVar10->fs[0];
    fVar14 = fVar3 - pfVar10->fs[0];
    if ((long)uVar21 < 1) {
      fVar19 = 0x7fffffff;
      if ((long)(int)fVar3 < (long)(uVar21 + 0x7fffffff)) {
        fVar19 = fVar14;
      }
    }
    else {
      fVar19 = 0x80000000;
      if ((long)(uVar21 | 0xffffffff80000000) < (long)(int)fVar3) {
        fVar19 = fVar14;
      }
    }
    pfVar9->fs[0] = fVar19;
    iVar4 = *(int *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
    iVar15 = *(int *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
    uVar21 = (ulong)iVar15;
    iVar15 = iVar4 - iVar15;
    if ((long)uVar21 < 1) {
      iVar20 = 0x7fffffff;
      if ((long)iVar4 < (long)(uVar21 + 0x7fffffff)) {
        iVar20 = iVar15;
      }
    }
    else {
      iVar20 = -0x80000000;
      if ((long)(uVar21 | 0xffffffff80000000) < (long)iVar4) {
        iVar20 = iVar15;
      }
    }
    *(int *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4) = iVar20;
    iVar4 = *(int *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
    iVar15 = *(int *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
    uVar21 = (ulong)iVar15;
    iVar15 = iVar4 - iVar15;
    if ((long)uVar21 < 1) {
      iVar20 = 0x7fffffff;
      if ((long)iVar4 < (long)(uVar21 + 0x7fffffff)) {
        iVar20 = iVar15;
      }
    }
    else {
      iVar20 = -0x80000000;
      if ((long)(uVar21 | 0xffffffff80000000) < (long)iVar4) {
        iVar20 = iVar15;
      }
    }
    *(int *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = iVar20;
    iVar4 = *(int *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
    iVar15 = *(int *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
    uVar21 = (ulong)iVar15;
    iVar15 = iVar4 - iVar15;
    if ((long)uVar21 < 1) {
      iVar20 = 0x7fffffff;
      if ((long)iVar4 < (long)(uVar21 + 0x7fffffff)) {
        iVar20 = iVar15;
      }
    }
    else {
      iVar20 = -0x80000000;
      if ((long)(uVar21 | 0xffffffff80000000) < (long)iVar4) {
        iVar20 = iVar15;
      }
    }
    *(int *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc) = iVar20;
    return;
  case 3:
    fVar5 = pfVar11->fd;
    fVar6 = pfVar10->fd;
    if ((long)fVar6 < 1) {
      fVar22 = fVar5 - fVar6;
      if ((long)(fVar6 + 0x7fffffffffffffff) <= (long)fVar5) {
        fVar22 = 0x7fffffffffffffff;
      }
    }
    else {
      fVar22 = 0x8000000000000000;
      if ((long)(fVar6 + 0x8000000000000000) < (long)fVar5) {
        fVar22 = fVar5 - fVar6;
      }
    }
    pfVar9->fd = fVar22;
    lVar7 = *(long *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
    lVar8 = *(long *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
    if (lVar8 < 1) {
      lVar16 = 0x7fffffffffffffff;
      if (lVar7 < lVar8 + 0x7fffffffffffffff) {
        lVar16 = lVar7 - lVar8;
      }
    }
    else {
      lVar16 = -0x8000000000000000;
      if (lVar8 + -0x8000000000000000 < lVar7) {
        lVar16 = lVar7 - lVar8;
      }
    }
    *(long *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = lVar16;
    return;
  }
  *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 10) = sVar18;
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
  sVar13 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
  uVar21 = (ulong)sVar13;
  sVar13 = sVar2 - sVar13;
  if ((long)uVar21 < 1) {
    sVar18 = 0x7fff;
    if ((long)sVar2 < (long)(uVar21 + 0x7fff)) {
      sVar18 = sVar13;
    }
  }
  else {
    sVar18 = -0x8000;
    if ((long)(uVar21 | 0xffffffffffff8000) < (long)sVar2) {
      sVar18 = sVar13;
    }
  }
  *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc) = sVar18;
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xe);
  sVar13 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xe);
  uVar21 = (ulong)sVar13;
  sVar13 = sVar2 - sVar13;
  if ((long)uVar21 < 1) {
    sVar18 = 0x7fff;
    if ((long)sVar2 < (long)(uVar21 + 0x7fff)) {
      sVar18 = sVar13;
    }
  }
  else {
    sVar18 = -0x8000;
    if ((long)(uVar21 | 0xffffffffffff8000) < (long)sVar2) {
      sVar18 = sVar13;
    }
  }
  *(short *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xe) = sVar18;
  return;
}

Assistant:

MSA_BINOP_DF(subv)
MSA_BINOP_DF(subs_s)
MSA_BINOP_DF(subs_u)
MSA_BINOP_DF(subsus_u)
MSA_BINOP_DF(subsuu_s)
MSA_BINOP_DF(mulv)
MSA_BINOP_DF(dotp_s)
MSA_BINOP_DF(dotp_u)

MSA_BINOP_DF(mul_q)
MSA_BINOP_DF(mulr_q)
#undef MSA_BINOP_DF

void helper_msa_sld_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                       uint32_t ws, uint32_t rt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);

    msa_sld_df(df, pwd, pws, env->active_tc.gpr[rt]);
}